

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

void __thiscall
mocker::detail::MoveInfo::clearAndInit
          (MoveInfo *this,
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          *nonPrecolored)

{
  pointer psVar1;
  key_type *pkVar2;
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var3;
  RegMap<MovSet> *this_00;
  shared_ptr<mocker::nasm::Register> *n;
  pointer __k;
  key_type *__k_00;
  
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)this);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->constrained)._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->frozen)._M_h);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(&(this->worklist)._M_h);
  this_00 = &this->associatedMoves;
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  psVar1 = (nonPrecolored->
           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (nonPrecolored->
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             )._M_impl.super__Vector_impl_data._M_start; pkVar2 = DAT_001f4548,
      __k_00 = (anonymous_namespace)::Colors, __k != psVar1; __k = __k + 1) {
    p_Var3 = &std::__detail::
              _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,__k)->_M_h;
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=(p_Var3,(initializer_list<std::shared_ptr<mocker::nasm::Mov>_>)ZEXT816(0));
  }
  for (; __k_00 != pkVar2; __k_00 = __k_00 + 1) {
    p_Var3 = &std::__detail::
              _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Mov>,_mocker::nasm::InstPtrHash,_mocker::nasm::InstPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,__k_00)->_M_h;
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Mov>,_std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>,_std::__detail::_Identity,_mocker::nasm::InstPtrEqual,_mocker::nasm::InstPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=(p_Var3,(initializer_list<std::shared_ptr<mocker::nasm::Mov>_>)ZEXT816(0));
  }
  return;
}

Assistant:

void MoveInfo::clearAndInit(const std::vector<Node> &nonPrecolored) {
  active.clear();
  constrained.clear();
  frozen.clear();
  worklist.clear();
  associatedMoves.clear();
  for (auto &n : nonPrecolored) {
    associatedMoves[n] = {};
  }
  for (auto &n : Colors) {
    associatedMoves[n] = {};
  }
}